

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_decoding_transform.h
# Opt level: O2

bool __thiscall
draco::PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
          (PredictionSchemeWrapDecodingTransform<int,_int> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined8 in_RAX;
  int max_value;
  int min_value;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar1 = DecoderBuffer::Decode<int>(buffer,(int *)((long)&local_18 + 4));
  if ((bVar1) && (bVar1 = DecoderBuffer::Decode<int>(buffer,(int *)&local_18), bVar1)) {
    if (local_18._4_4_ <= (int)local_18) {
      (this->super_PredictionSchemeWrapTransformBase<int>).min_value_ = local_18._4_4_;
      (this->super_PredictionSchemeWrapTransformBase<int>).max_value_ = (int)local_18;
      bVar1 = PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
                        (&this->super_PredictionSchemeWrapTransformBase<int>);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT min_value, max_value;
    if (!buffer->Decode(&min_value)) {
      return false;
    }
    if (!buffer->Decode(&max_value)) {
      return false;
    }
    if (min_value > max_value) {
      return false;
    }
    this->set_min_value(min_value);
    this->set_max_value(max_value);
    if (!this->InitCorrectionBounds()) {
      return false;
    }
    return true;
  }